

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_cvc.c
# Opt level: O1

bool_t btokCVCNameIsValid(char *name)

{
  bool_t bVar1;
  size_t sVar2;
  uint uVar3;
  
  bVar1 = strIsValid(name);
  uVar3 = 0;
  if (bVar1 != 0) {
    sVar2 = strLen(name);
    if (7 < sVar2) {
      sVar2 = strLen(name);
      if (sVar2 < 0xd) {
        bVar1 = strIsPrintable(name);
        uVar3 = (uint)(bVar1 != 0);
      }
    }
  }
  return uVar3;
}

Assistant:

static bool_t btokCVCNameIsValid(const char* name)
{
	return strIsValid(name) &&
		8 <= strLen(name) && strLen(name) <= 12 &&
		strIsPrintable(name);
}